

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong mkvparser::Segment::CreateInstance
                   (IMkvReader *pReader,longlong pos,Segment **pSegment,Type type)

{
  Segment **elem_start;
  int iVar1;
  longlong lVar2;
  longlong lVar3;
  long lVar4;
  Segment *this;
  Segment *local_a0;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  long len;
  long status;
  longlong available;
  longlong total;
  Segment **ppSStack_28;
  Type type_local;
  Segment **pSegment_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  
  if ((pReader == (IMkvReader *)0x0) || (pos < 0)) {
    pReader_local = (IMkvReader *)0xffffffffffffffff;
  }
  else {
    *pSegment = (Segment *)0x0;
    total._4_4_ = type;
    ppSStack_28 = pSegment;
    pSegment_local = (Segment **)pos;
    pos_local = (longlong)pReader;
    iVar1 = (*pReader->_vptr_IMkvReader[1])(pReader,&available,&status);
    len = (long)iVar1;
    pReader_local = (IMkvReader *)len;
    if (-1 < len) {
      if (status < 0) {
        pReader_local = (IMkvReader *)0xffffffffffffffff;
      }
      else if ((available < 0) || (status <= available)) {
        while( true ) {
          if ((-1 < available) && (available <= (long)pSegment_local)) {
            return -2;
          }
          lVar2 = GetUIntLength((IMkvReader *)pos_local,(longlong)pSegment_local,&result);
          elem_start = pSegment_local;
          if (lVar2 != 0) {
            return lVar2;
          }
          if ((-1 < available) && (available < (long)pSegment_local + result)) {
            return -2;
          }
          if (status < (long)pSegment_local + result) {
            return (long)pSegment_local + result;
          }
          lVar2 = ReadID((IMkvReader *)pos_local,(longlong)pSegment_local,&result);
          if (lVar2 < 0) {
            return -2;
          }
          pSegment_local = (Segment **)(result + (long)pSegment_local);
          lVar3 = GetUIntLength((IMkvReader *)pos_local,(longlong)pSegment_local,&result);
          if (lVar3 != 0) {
            return lVar3;
          }
          if ((-1 < available) && (available < (long)pSegment_local + result)) {
            return -2;
          }
          if (status < (long)pSegment_local + result) {
            return (long)pSegment_local + result;
          }
          unknown_size = ReadUInt((IMkvReader *)pos_local,(longlong)pSegment_local,&result);
          if (unknown_size < 0) {
            return unknown_size;
          }
          pSegment_local = (Segment **)(result + (long)pSegment_local);
          lVar4 = (1L << ((char)result * '\a' & 0x3fU)) + -1;
          if (lVar2 == 0x18538067) {
            if (unknown_size == lVar4) {
              unknown_size = -1;
            }
            else if (available < 0) {
              unknown_size = -1;
            }
            else if (available < (long)pSegment_local + unknown_size) {
              unknown_size = -1;
            }
            this = (Segment *)operator_new(0xd0,(nothrow_t *)&std::nothrow);
            local_a0 = (Segment *)0x0;
            if (this != (Segment *)0x0) {
              Segment(this,(IMkvReader *)pos_local,(longlong)elem_start,(longlong)pSegment_local,
                      unknown_size,total._4_4_);
              local_a0 = this;
            }
            *ppSStack_28 = local_a0;
            if (*ppSStack_28 == (Segment *)0x0) {
              return -1;
            }
            return 0;
          }
          if (unknown_size == lVar4) {
            return -2;
          }
          if ((-1 < available) && (available < (long)pSegment_local + unknown_size)) {
            return -2;
          }
          if (status < (long)pSegment_local + unknown_size) break;
          pSegment_local = (Segment **)(unknown_size + (long)pSegment_local);
        }
        pReader_local = (IMkvReader *)((long)pSegment_local + unknown_size);
      }
      else {
        pReader_local = (IMkvReader *)0xffffffffffffffff;
      }
    }
  }
  return (longlong)pReader_local;
}

Assistant:

long long Segment::CreateInstance(IMkvReader* pReader, long long pos,
                                  Segment*& pSegment, Type type) {
  if (pReader == NULL || pos < 0)
    return E_PARSE_FAILED;

  pSegment = NULL;

  long long total, available;

  const long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (available < 0)
    return -1;

  if ((total >= 0) && (available > total))
    return -1;

  // I would assume that in practice this loop would execute
  // exactly once, but we allow for other elements (e.g. Void)
  // to immediately follow the EBML header.  This is fine for
  // the source filter case (since the entire file is available),
  // but in the splitter case over a network we should probably
  // just give up early.  We could for example decide only to
  // execute this loop a maximum of, say, 10 times.
  // TODO:
  // There is an implied "give up early" by only parsing up
  // to the available limit.  We do do that, but only if the
  // total file size is unknown.  We could decide to always
  // use what's available as our limit (irrespective of whether
  // we happen to know the total file length).  This would have
  // as its sense "parse this much of the file before giving up",
  // which a slightly different sense from "try to parse up to
  // 10 EMBL elements before giving up".

  for (;;) {
    if ((total >= 0) && (pos >= total))
      return E_FILE_FORMAT_INVALID;

    // Read ID
    long len;
    long long result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    // Read Size

    result = GetUIntLength(pReader, pos, len);

    if (result)  // error, or too few available bytes
      return result;

    if ((total >= 0) && ((pos + len) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return size;

    pos += len;  // consume length of size of element

    // Pos now points to start of payload

    // Handle "unknown size" for live streaming of webm files.
    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (id == libwebm::kMkvSegment) {
      if (size == unknown_size)
        size = -1;

      else if (total < 0)
        size = -1;

      else if ((pos + size) > total)
        size = -1;

      pSegment = new (std::nothrow) Segment(pReader, idpos, pos, size, type);
      if (pSegment == NULL)
        return E_PARSE_FAILED;

      return 0;  // success
    }

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && ((pos + size) > total))
      return E_FILE_FORMAT_INVALID;

    if ((pos + size) > available)
      return pos + size;

    pos += size;  // consume payload
  }
}